

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split_string(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istringstream iss;
  allocator_type local_1f1;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1f0;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1c0;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream(local_190,(string *)str,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1c0,(istream_type *)local_190);
  paVar1 = &local_1f0._M_value.field_2;
  local_1f0._M_stream = (istream_type *)0x0;
  local_1f0._M_value._M_string_length = 0;
  local_1f0._M_value.field_2._M_local_buf[0] = '\0';
  local_1f0._M_ok = false;
  local_1f0._M_value._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_1c0,&local_1f0,&local_1f1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_value._M_dataplus._M_p,
                    CONCAT71(local_1f0._M_value.field_2._M_allocated_capacity._1_7_,
                             local_1f0._M_value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_value._M_dataplus._M_p != &local_1c0._M_value.field_2) {
    operator_delete(local_1c0._M_value._M_dataplus._M_p,
                    local_1c0._M_value.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split_string(const std::string str) {
	std::istringstream iss(str);
	return {std::istream_iterator<std::string>{iss}, std::istream_iterator<std::string>{}};
}